

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::ScissorAPI::compareScissorBoxes
          (ScissorAPI *this,vector<int,_std::allocator<int>_> *left,
          vector<int,_std::allocator<int>_> *right,GLchar *description,bool *out_result)

{
  ostringstream *this_00;
  pointer piVar1;
  MessageBuilder *pMVar2;
  ulong uVar3;
  long lVar4;
  undefined1 local_1b0 [384];
  
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar4 = 0;
  for (uVar3 = 0;
      piVar1 = (left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
      uVar3 < (ulong)((long)(left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar3 = uVar3 + 1) {
    if (*(int *)((long)piVar1 + lVar4) !=
        *(int *)((long)(right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar4)) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Test case: ");
      std::operator<<((ostream *)this_00,description);
      std::operator<<((ostream *)this_00," Invalid values [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"] ");
      pMVar2 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          (int *)((long)(left->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar4));
      std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ");
      pMVar2 = tcu::MessageBuilder::operator<<
                         (pMVar2,(int *)((long)(right->super__Vector_base<int,_std::allocator<int>_>
                                               )._M_impl.super__Vector_impl_data._M_start + lVar4));
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      *out_result = false;
    }
    lVar4 = lVar4 + 4;
  }
  return;
}

Assistant:

void ScissorAPI::compareScissorBoxes(std::vector<GLint>& left, std::vector<GLint>& right, const GLchar* description,
									 bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;

			out_result = false;
		}
	}
}